

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int dupedExprSize(Expr *p,int flags)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  while ((iVar1 = 0, p != (Expr *)0x0 && (iVar1 = dupedExprNodeSize(p,flags), (flags & 1U) != 0))) {
    iVar2 = dupedExprSize(p->pLeft,flags);
    p = p->pRight;
    iVar3 = iVar1 + iVar3 + iVar2;
  }
  return iVar1 + iVar3;
}

Assistant:

static int dupedExprSize(Expr *p, int flags){
  int nByte = 0;
  if( p ){
    nByte = dupedExprNodeSize(p, flags);
    if( flags&EXPRDUP_REDUCE ){
      nByte += dupedExprSize(p->pLeft, flags) + dupedExprSize(p->pRight, flags);
    }
  }
  return nByte;
}